

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O3

QPDFObjectHandle __thiscall
QPDFParser::withDescription<QPDF_Integer,long_long>(QPDFParser *this,longlong *args)

{
  size_type sVar1;
  string *this_00;
  size_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar2;
  
  sVar1 = *in_RDX;
  this_00 = (string *)operator_new(0x70);
  this_00->_M_string_length = 0x100000001;
  (this_00->_M_dataplus)._M_p = (pointer)&PTR___Sp_counted_ptr_inplace_002eaaf0;
  (this_00->field_2)._M_allocated_capacity = sVar1;
  *(undefined1 *)&this_00[2]._M_dataplus._M_p = 4;
  this_00[2].field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this_00[2].field_2 + 8) = 0;
  this_00[3]._M_dataplus._M_p = (pointer)0x0;
  this_00[3]._M_string_length = 0xffffffffffffffff;
  sVar1 = args[0xf];
  *(longlong *)((long)&this_00[2].field_2 + 8) = args[4];
  this_00[2]._M_string_length = args[5];
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this_00[2].field_2._M_allocated_capacity
             ,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(args + 6));
  if ((long)this_00[3]._M_string_length < 0) {
    this_00[3]._M_string_length = sVar1;
  }
  this->input = (InputSource *)&this_00->field_2;
  this->object_description = this_00;
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&this_00->_M_string_length = (int)this_00->_M_string_length + 1;
    UNLOCK();
  }
  else {
    *(int *)&this_00->_M_string_length = (int)this_00->_M_string_length + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFParser::withDescription(Args&&... args)
{
    auto obj = QPDFObject::create<T>(std::forward<Args>(args)...);
    obj->setDescription(context, description, start);
    return {obj};
}